

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O2

void finish(cbify *data)

{
  cbify_adf_data *this;
  pointer pvVar1;
  size_t a;
  ulong uVar2;
  pointer pvVar3;
  v_array<ACTION_SCORE::action_score> as;
  v_array<ACTION_SCORE::action_score> local_48;
  
  (*(code *)PTR_delete_label_002b1b58)();
  v_array<ACTION_SCORE::action_score>::delete_v(&data->a_s);
  if (data->use_adf == true) {
    this = &data->adf_data;
    for (uVar2 = 0; uVar2 < (data->adf_data).num_actions; uVar2 = uVar2 + 1) {
      v_array<ACTION_SCORE::action_score>::delete_v
                ((v_array<ACTION_SCORE::action_score> *)
                 &((this->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2]->pred).scalars);
      VW::dealloc_example((_func_void_void_ptr *)PTR_delete_label_002b1b58,
                          (this->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar2],(_func_void_void_ptr *)0x0
                         );
      free((this->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2]);
    }
    std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base
              ((_Vector_base<example_*,_std::allocator<example_*>_> *)this);
    std::
    _Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
    ::~_Vector_base(&(data->cs_costs).
                     super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                   );
    std::_Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::~_Vector_base
              (&(data->cb_costs).
                super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>);
    pvVar1 = (data->cb_as).
             super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar3 = (data->cb_as).
                  super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar1; pvVar3 = pvVar3 + 1)
    {
      local_48._begin = pvVar3->_begin;
      local_48._end = pvVar3->_end;
      local_48.end_array = pvVar3->end_array;
      local_48.erase_count = pvVar3->erase_count;
      v_array<ACTION_SCORE::action_score>::delete_v(&local_48);
    }
    std::
    _Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::~_Vector_base(&(data->cb_as).
                     super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                   );
  }
  return;
}

Assistant:

void finish(cbify& data)
{
  CB::cb_label.delete_label(&data.cb_label);
  data.a_s.delete_v();

  if (data.use_adf)
  {
    for (size_t a = 0; a < data.adf_data.num_actions; ++a)
      {
        data.adf_data.ecs[a]->pred.a_s.delete_v();
        VW::dealloc_example(CB::cb_label.delete_label, *data.adf_data.ecs[a]);
        free_it(data.adf_data.ecs[a]);
      }
    data.adf_data.ecs.~vector<example*>();
    data.cs_costs.~vector<v_array<COST_SENSITIVE::wclass>>();
    data.cb_costs.~vector<v_array<CB::cb_class>>();
    for (auto as : data.cb_as)
      as.delete_v();
    data.cb_as.~vector<ACTION_SCORE::action_scores>();
  }
}